

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 pager_cksum(Pager *pPager,u8 *aData)

{
  int local_20;
  u32 local_1c;
  int i;
  u32 cksum;
  u8 *aData_local;
  Pager *pPager_local;
  
  local_1c = pPager->cksumInit;
  local_20 = (int)pPager->pageSize;
  while (local_20 = local_20 + -200, 0 < local_20) {
    local_1c = aData[local_20] + local_1c;
  }
  return local_1c;
}

Assistant:

static u32 pager_cksum(Pager *pPager, const u8 *aData){
  u32 cksum = pPager->cksumInit;         /* Checksum value to return */
  int i = pPager->pageSize-200;          /* Loop counter */
  while( i>0 ){
    cksum += aData[i];
    i -= 200;
  }
  return cksum;
}